

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main_FCBPNN_classify(void)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  reference sample;
  reference label;
  ostream *poVar1;
  reference pvVar2;
  double dVar3;
  allocator<double> local_311;
  double local_310 [2];
  iterator local_300;
  size_type local_2f8;
  vector<double,_std::allocator<double>_> local_2f0;
  allocator<double> local_2d1;
  double local_2d0 [2];
  iterator local_2c0;
  size_type local_2b8;
  vector<double,_std::allocator<double>_> local_2b0;
  undefined1 local_298 [8];
  vector<double,_std::allocator<double>_> output;
  double dStack_278;
  int i;
  double cost;
  double local_268;
  iterator local_260;
  size_type local_258;
  vector<double,_std::allocator<double>_> local_250;
  allocator<double> local_231;
  double local_230 [2];
  iterator local_220;
  size_type local_218;
  vector<double,_std::allocator<double>_> local_210;
  allocator<double> local_1f1;
  double local_1f0;
  iterator local_1e8;
  size_type local_1e0;
  vector<double,_std::allocator<double>_> local_1d8;
  allocator<double> local_1b9;
  double local_1b8 [2];
  iterator local_1a8;
  size_type local_1a0;
  vector<double,_std::allocator<double>_> local_198;
  allocator<double> local_179;
  double local_178;
  iterator local_170;
  size_type local_168;
  vector<double,_std::allocator<double>_> local_160;
  allocator<double> local_141;
  double local_140 [2];
  iterator local_130;
  size_type local_128;
  vector<double,_std::allocator<double>_> local_120;
  allocator<double> local_101;
  double local_100;
  iterator local_f8;
  size_type local_f0;
  vector<double,_std::allocator<double>_> local_e8;
  allocator<double> local_b9;
  double local_b8 [2];
  iterator local_a8;
  size_type local_a0;
  vector<double,_std::allocator<double>_> local_98;
  undefined1 local_80 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  samples;
  FC_BPNN bp;
  
  FC_BPNN::FC_BPNN((FC_BPNN *)
                   &samples.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,2,10,1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&labels.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_80);
  local_b8[0] = 1.0;
  local_b8[1] = 0.0;
  local_a8 = local_b8;
  local_a0 = 2;
  std::allocator<double>::allocator(&local_b9);
  __l_08._M_len = local_a0;
  __l_08._M_array = local_a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_08,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&labels.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
  std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  std::allocator<double>::~allocator(&local_b9);
  local_100 = 1.0;
  local_f8 = &local_100;
  local_f0 = 1;
  std::allocator<double>::allocator(&local_101);
  __l_07._M_len = local_f0;
  __l_07._M_array = local_f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_e8,__l_07,&local_101);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_80,&local_e8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_e8);
  std::allocator<double>::~allocator(&local_101);
  local_140[0] = 0.0;
  local_140[1] = 1.0;
  local_130 = local_140;
  local_128 = 2;
  std::allocator<double>::allocator(&local_141);
  __l_06._M_len = local_128;
  __l_06._M_array = local_130;
  std::vector<double,_std::allocator<double>_>::vector(&local_120,__l_06,&local_141);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&labels.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
  std::vector<double,_std::allocator<double>_>::~vector(&local_120);
  std::allocator<double>::~allocator(&local_141);
  local_178 = 1.0;
  local_170 = &local_178;
  local_168 = 1;
  std::allocator<double>::allocator(&local_179);
  __l_05._M_len = local_168;
  __l_05._M_array = local_170;
  std::vector<double,_std::allocator<double>_>::vector(&local_160,__l_05,&local_179);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_80,&local_160);
  std::vector<double,_std::allocator<double>_>::~vector(&local_160);
  std::allocator<double>::~allocator(&local_179);
  local_1b8[0] = 1.0;
  local_1b8[1] = 1.0;
  local_1a8 = local_1b8;
  local_1a0 = 2;
  std::allocator<double>::allocator(&local_1b9);
  __l_04._M_len = local_1a0;
  __l_04._M_array = local_1a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_198,__l_04,&local_1b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&labels.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
  std::vector<double,_std::allocator<double>_>::~vector(&local_198);
  std::allocator<double>::~allocator(&local_1b9);
  local_1f0 = 0.0;
  local_1e8 = &local_1f0;
  local_1e0 = 1;
  std::allocator<double>::allocator(&local_1f1);
  __l_03._M_len = local_1e0;
  __l_03._M_array = local_1e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_1d8,__l_03,&local_1f1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_80,&local_1d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1d8);
  std::allocator<double>::~allocator(&local_1f1);
  local_230[0] = 0.0;
  local_230[1] = 0.0;
  local_220 = local_230;
  local_218 = 2;
  std::allocator<double>::allocator(&local_231);
  __l_02._M_len = local_218;
  __l_02._M_array = local_220;
  std::vector<double,_std::allocator<double>_>::vector(&local_210,__l_02,&local_231);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&labels.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_210);
  std::vector<double,_std::allocator<double>_>::~vector(&local_210);
  std::allocator<double>::~allocator(&local_231);
  local_268 = 0.0;
  local_260 = &local_268;
  local_258 = 1;
  std::allocator<double>::allocator((allocator<double> *)((long)&cost + 7));
  __l_01._M_len = local_258;
  __l_01._M_array = local_260;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_250,__l_01,(allocator<double> *)((long)&cost + 7));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_80,&local_250);
  std::vector<double,_std::allocator<double>_>::~vector(&local_250);
  std::allocator<double>::~allocator((allocator<double> *)((long)&cost + 7));
  dStack_278 = 0.0;
  for (output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 1;
      output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 0x7d1;
      output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    sample = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&labels.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ % 4));
    label = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_80,
                         (long)(output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_ % 4));
    dVar3 = FC_BPNN::train_once((FC_BPNN *)
                                &samples.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,sample,label);
    dStack_278 = dVar3 + dStack_278;
    if (output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ % 100 == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar1 = std::operator<<(poVar1," cost: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_278 / 100.0);
      poVar1 = std::operator<<(poVar1," step: ");
      dVar3 = FC_BPNN::getLearningStep
                        ((FC_BPNN *)
                         &samples.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      dStack_278 = 0.0;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_298);
  local_2d0[0] = 0.1;
  local_2d0[1] = 0.2;
  local_2c0 = local_2d0;
  local_2b8 = 2;
  std::allocator<double>::allocator(&local_2d1);
  __l_00._M_len = local_2b8;
  __l_00._M_array = local_2c0;
  std::vector<double,_std::allocator<double>_>::vector(&local_2b0,__l_00,&local_2d1);
  FC_BPNN::predict((FC_BPNN *)
                   &samples.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b0,
                   (vector<double,_std::allocator<double>_> *)local_298);
  std::vector<double,_std::allocator<double>_>::~vector(&local_2b0);
  std::allocator<double>::~allocator(&local_2d1);
  poVar1 = std::operator<<((ostream *)&std::cout,"prediction: ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_298,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_310[0] = 0.21;
  local_310[1] = 0.9;
  local_300 = local_310;
  local_2f8 = 2;
  std::allocator<double>::allocator(&local_311);
  __l._M_len = local_2f8;
  __l._M_array = local_300;
  std::vector<double,_std::allocator<double>_>::vector(&local_2f0,__l,&local_311);
  FC_BPNN::predict((FC_BPNN *)
                   &samples.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2f0,
                   (vector<double,_std::allocator<double>_> *)local_298);
  std::vector<double,_std::allocator<double>_>::~vector(&local_2f0);
  std::allocator<double>::~allocator(&local_311);
  poVar1 = std::operator<<((ostream *)&std::cout,"prediction: ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_298,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_298);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&labels.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FC_BPNN::~FC_BPNN((FC_BPNN *)
                    &samples.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int main_FCBPNN_classify() {
	FC_BPNN bp(2, 10, 1);

	std::vector<std::vector<double>> samples;
	std::vector<std::vector<double>> labels;
	samples.push_back({ 1.0,0.0 }); labels.push_back({ 1.0 });
	samples.push_back({ 0.0,1.0 }); labels.push_back({ 1.0 });
	samples.push_back({ 1.0,1.0 }); labels.push_back({ 0.0 });
	samples.push_back({ 0.0,0.0 }); labels.push_back({ 0.0 });
	double cost = 0.0;
	for (int i = 1; i <= 2000; i++) {
		cost += bp.train_once(samples[i % 4], labels[i % 4]);
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			cost = 0.0;
		}
	}
	std::vector<double> output;
	bp.predict({ 0.1, 0.2}, output);
	std::cout << "prediction: " << output[0] << std::endl;
	bp.predict({ 0.21, 0.9 }, output);
	std::cout << "prediction: " << output[0] << std::endl;
	return 1;
}